

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

void __thiscall tl::StrT<char>::resize(StrT<char> *this,u32 size)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (size == 0) {
    this->_size = 0;
    pcVar2 = this->_str;
  }
  else {
    pcVar2 = growIfNeeded(this,size);
    if (pcVar2 != (char *)0x0) {
      if (this->_size != 0) {
        uVar3 = 0;
        do {
          pcVar2[uVar3] = this->_str[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->_size);
      }
      pcVar1 = this->_str;
      if (pcVar1 != (char *)0x0 && pcVar1 != &s_emptyStr<char>) {
        operator_delete__(pcVar1);
      }
      this->_str = pcVar2;
    }
    this->_size = size;
    pcVar2 = this->_str + size;
  }
  *pcVar2 = '\0';
  return;
}

Assistant:

void StrT<CharT>::resize(u32 size)
{
    if(size == 0) {
        _size = 0;
        _str[0] = 0;
        return;
    }
    if(auto str = growIfNeeded(size)) {
        for(u32 i = 0; i < _size; i++) {
            str[i] = _str[i];
        }
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = str;
    }
    _size = size;
    _str[size] = 0;
}